

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SegmentIsMaxLevel(Fts3Table *p,i64 iAbsLevel,int *pbMax)

{
  int iVar1;
  sqlite3_stmt *psStack_30;
  int rc;
  sqlite3_stmt *pStmt;
  int *pbMax_local;
  i64 iAbsLevel_local;
  Fts3Table *p_local;
  
  pStmt = (sqlite3_stmt *)pbMax;
  pbMax_local = (int *)iAbsLevel;
  iAbsLevel_local = (i64)p;
  p_local._4_4_ = fts3SqlStmt(p,0xf,&stack0xffffffffffffffd0,(sqlite3_value **)0x0);
  if (p_local._4_4_ == 0) {
    sqlite3_bind_int64(psStack_30,1,(long)pbMax_local + 1);
    sqlite3_bind_int64(psStack_30,2,((long)pbMax_local / 0x400 + 1) * 0x400);
    *(undefined4 *)pStmt = 0;
    iVar1 = sqlite3_step(psStack_30);
    if (iVar1 == 100) {
      iVar1 = sqlite3_column_type(psStack_30,0);
      *(uint *)pStmt = (uint)(iVar1 == 5);
    }
    p_local._4_4_ = sqlite3_reset(psStack_30);
  }
  return p_local._4_4_;
}

Assistant:

static int fts3SegmentIsMaxLevel(Fts3Table *p, i64 iAbsLevel, int *pbMax){

  /* Set pStmt to the compiled version of:
  **
  **   SELECT max(level) FROM %Q.'%q_segdir' WHERE level BETWEEN ? AND ?
  **
  ** (1024 is actually the value of macro FTS3_SEGDIR_PREFIXLEVEL_STR).
  */
  sqlite3_stmt *pStmt;
  int rc = fts3SqlStmt(p, SQL_SELECT_SEGDIR_MAX_LEVEL, &pStmt, 0);
  if( rc!=SQLITE_OK ) return rc;
  sqlite3_bind_int64(pStmt, 1, iAbsLevel+1);
  sqlite3_bind_int64(pStmt, 2, 
      ((iAbsLevel/FTS3_SEGDIR_MAXLEVEL)+1) * FTS3_SEGDIR_MAXLEVEL
  );

  *pbMax = 0;
  if( SQLITE_ROW==sqlite3_step(pStmt) ){
    *pbMax = sqlite3_column_type(pStmt, 0)==SQLITE_NULL;
  }
  return sqlite3_reset(pStmt);
}